

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::correctInput(HlslParseContext *this,TQualifier *qualifier)

{
  bool bVar1;
  EShLanguage EVar2;
  
  TQualifier::clearUniformLayout(qualifier);
  qualifier->layoutPushConstant = false;
  EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (EVar2 == EShLangVertex) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffc01f1fffffff;
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
  }
  if ((EVar2 == EShLangTessEvaluation) ||
     (qualifier->field_0xd = qualifier->field_0xd & 0xef,
     (this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment)) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffd01f1fffffff;
  }
  *(ulong *)&qualifier->field_0x1c = *(ulong *)&qualifier->field_0x1c | 0xff00000000000000;
  *(ulong *)&qualifier->field_0x24 = *(ulong *)&qualifier->field_0x24 | 0x7fffffff;
  bVar1 = isInputBuiltIn(this,qualifier);
  if (!bVar1) {
    *(ushort *)&qualifier->field_0x8 = *(ushort *)&qualifier->field_0x8 & 0x7f;
  }
  return;
}

Assistant:

void HlslParseContext::correctInput(TQualifier& qualifier)
{
    clearUniform(qualifier);
    if (language == EShLangVertex)
        qualifier.clearInterstage();
    if (language != EShLangTessEvaluation)
        qualifier.patch = false;
    if (language != EShLangFragment) {
        qualifier.clearInterpolation();
        qualifier.sample = false;
    }

    qualifier.clearStreamLayout();
    qualifier.clearXfbLayout();

    if (! isInputBuiltIn(qualifier))
        qualifier.builtIn = EbvNone;
}